

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
::_container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *column,
          Index pos,Dimension dim)

{
  _Rb_tree_header *p_Var1;
  Column_support *pCVar2;
  pointer pEVar3;
  Column_hook *pCVar4;
  node_ptr to_erase;
  long lVar5;
  pointer pEVar6;
  _Base_ptr p_Var7;
  ID_index pivot;
  Index local_6c;
  _Rb_tree_color local_68;
  uint local_64;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  local_60;
  
  p_Var1 = &(column->_M_t)._M_impl.super__Rb_tree_header;
  local_6c = pos;
  lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header);
  local_64 = *(uint *)(lVar5 + 0x20);
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::try_emplace<unsigned_int_const&,unsigned_int&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 200),(const_iterator)0x0,&local_64,&local_6c);
  local_60.entryPool_ = *(Entry_constructor **)(this + 0x108);
  p_Var7 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60.super_Column_dimension_option.dim_ = dim;
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
         (node_ptr)&local_60.column_;
    local_60.super_Chain_column_option.pivot_ = 0xffffffff;
    local_60.super_Chain_column_option.pairedColumn_ = 0xffffffff;
    local_60.operators_ = (Field_operators *)0x0;
    local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  }
  else {
    lVar5 = std::_Rb_tree_decrement(&p_Var1->_M_header);
    pCVar2 = &local_60.column_;
    local_60.super_Chain_column_option.pairedColumn_ = 0xffffffff;
    local_60.super_Chain_column_option.pivot_ = *(ID_index *)(lVar5 + 0x20);
    local_60.operators_ = (Field_operators *)0x0;
    local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar2;
    local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar2;
    do {
      local_68 = p_Var7[1]._M_color;
      pEVar6 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
               ::construct<unsigned_int&>
                         ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
                           *)local_60.entryPool_,&local_68);
      if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)pCVar2;
      pCVar4 = (Column_hook *)
               &(local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_)->next_
      ;
      local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pEVar6
      ;
      (pCVar4->super_type).super_type.super_list_node<void_*>.next_ = (node_ptr)pEVar6;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 0x90),(const_iterator)0x0,&local_6c,&local_60);
  pEVar6 = (pointer)local_60.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (pEVar6 != (pointer)&local_60.column_) {
    pEVar3 = (pointer)(pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.
                      next_;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>
    ::destroy(&(local_60.entryPool_)->entryPool_,pEVar6);
    pEVar6 = pEVar3;
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_container_insert(const Container& column, Index pos, Dimension dim)
{
  ID_index pivot;
  if constexpr (Master_matrix::Option_list::is_z2) {
    pivot = *(column.rbegin());
  } else {
    pivot = column.rbegin()->first;
  }
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.try_emplace(pivot, pos);
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, dim, colSettings_);
    }
    pivotToColumnIndex_[pivot] = pos;
  }
}